

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

VertexIter __thiscall CMU462::HalfedgeMesh::newVertex(HalfedgeMesh *this)

{
  Vertex local_118;
  iterator local_28;
  const_iterator local_20;
  HalfedgeMesh *local_18;
  HalfedgeMesh *this_local;
  
  local_18 = this;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end(&this->vertices);
  std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_20,&local_28);
  local_118.quadric.entries[3].w = 0.0;
  local_118._halfedge._M_node = (_List_node_base *)0x0;
  local_118.quadric.entries[3].y = 0.0;
  local_118.quadric.entries[3].z = 0.0;
  local_118.quadric.entries[2].w = 0.0;
  local_118.quadric.entries[3].x = 0.0;
  local_118.quadric.entries[2].y = 0.0;
  local_118.quadric.entries[2].z = 0.0;
  local_118.quadric.entries[1].w = 0.0;
  local_118.quadric.entries[2].x = 0.0;
  local_118.quadric.entries[1].y = 0.0;
  local_118.quadric.entries[1].z = 0.0;
  local_118.quadric.entries[0].w = 0.0;
  local_118.quadric.entries[1].x = 0.0;
  local_118.quadric.entries[0].y = 0.0;
  local_118.quadric.entries[0].z = 0.0;
  local_118.velocity = 0.0;
  local_118._100_4_ = 0;
  local_118.quadric.entries[0].x = 0.0;
  local_118.index = 0;
  local_118.isNew = false;
  local_118._89_3_ = 0;
  local_118.offset = 0.0;
  local_118.newPosition.y = 0.0;
  local_118.newPosition.z = 0.0;
  local_118.bindPosition.z = 0.0;
  local_118.newPosition.x = 0.0;
  local_118.bindPosition.x = 0.0;
  local_118.bindPosition.y = 0.0;
  local_118.position.y = 0.0;
  local_118.position.z = 0.0;
  local_118.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)0x0;
  local_118.position.x = 0.0;
  Vertex::Vertex(&local_118);
  this_local = (HalfedgeMesh *)
               std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::insert
                         (&this->vertices,local_20,&local_118);
  Vertex::~Vertex(&local_118);
  return (VertexIter)(_List_node_base *)this_local;
}

Assistant:

VertexIter newVertex() {
          return vertices.insert(vertices.end(), Vertex());
        }